

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Assembler.cpp
# Opt level: O0

string * Assembler::rType(string *__return_storage_ptr__,string *operation,int line)

{
  bool bVar1;
  uint uVar2;
  reference pvVar3;
  int in_ECX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_390;
  string local_370;
  string local_350;
  string local_330;
  string local_310;
  string local_2f0;
  string local_2d0;
  string local_2b0;
  string local_290;
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  undefined1 local_150 [8];
  string func;
  string shift;
  string rt;
  string rd;
  string rs;
  undefined1 local_90 [8];
  string opcode;
  allocator local_59;
  string local_58;
  undefined1 local_38 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  v;
  int line_local;
  string *operation_local;
  
  v.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = line;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_58,"(\\s|,)+",&local_59);
  HelpFuncts::split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_38,operation,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  pvVar3 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_38,0);
  std::__cxx11::string::string((string *)(rs.field_2._M_local_buf + 8),(string *)pvVar3);
  AsmFuncts::getOpCode((string *)local_90,(string *)((long)&rs.field_2 + 8));
  std::__cxx11::string::~string((string *)(rs.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(rd.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(rt.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(shift.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(func.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)local_150);
  pvVar3 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_38,0);
  bVar1 = std::operator==(pvVar3,"sll");
  if (!bVar1) {
    pvVar3 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_38,0);
    bVar1 = std::operator==(pvVar3,"srl");
    if (!bVar1) {
      pvVar3 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_38,2);
      std::__cxx11::string::string((string *)&local_290,(string *)pvVar3);
      AsmFuncts::getRegCode(&local_270,&local_290);
      std::__cxx11::string::operator=((string *)(rd.field_2._M_local_buf + 8),(string *)&local_270);
      std::__cxx11::string::~string((string *)&local_270);
      std::__cxx11::string::~string((string *)&local_290);
      pvVar3 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_38,3);
      std::__cxx11::string::string((string *)&local_2d0,(string *)pvVar3);
      AsmFuncts::getRegCode(&local_2b0,&local_2d0);
      std::__cxx11::string::operator=
                ((string *)(shift.field_2._M_local_buf + 8),(string *)&local_2b0);
      std::__cxx11::string::~string((string *)&local_2b0);
      std::__cxx11::string::~string((string *)&local_2d0);
      pvVar3 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_38,1);
      std::__cxx11::string::string((string *)&local_310,(string *)pvVar3);
      AsmFuncts::getRegCode(&local_2f0,&local_310);
      std::__cxx11::string::operator=((string *)(rt.field_2._M_local_buf + 8),(string *)&local_2f0);
      std::__cxx11::string::~string((string *)&local_2f0);
      std::__cxx11::string::~string((string *)&local_310);
      Conversion::decToBin_abi_cxx11_(&local_330,(Conversion *)0x0,5,in_ECX);
      std::__cxx11::string::operator=
                ((string *)(func.field_2._M_local_buf + 8),(string *)&local_330);
      std::__cxx11::string::~string((string *)&local_330);
      pvVar3 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_38,0);
      std::__cxx11::string::string((string *)&local_370,(string *)pvVar3);
      AsmFuncts::getFuncCode(&local_350,&local_370);
      std::__cxx11::string::operator=((string *)local_150,(string *)&local_350);
      std::__cxx11::string::~string((string *)&local_350);
      std::__cxx11::string::~string((string *)&local_370);
      goto LAB_00151525;
    }
  }
  Conversion::decToBin_abi_cxx11_(&local_170,(Conversion *)0x0,5,in_ECX);
  std::__cxx11::string::operator=((string *)(rd.field_2._M_local_buf + 8),(string *)&local_170);
  std::__cxx11::string::~string((string *)&local_170);
  pvVar3 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_38,2);
  std::__cxx11::string::string((string *)&local_1b0,(string *)pvVar3);
  AsmFuncts::getRegCode(&local_190,&local_1b0);
  std::__cxx11::string::operator=((string *)(shift.field_2._M_local_buf + 8),(string *)&local_190);
  std::__cxx11::string::~string((string *)&local_190);
  std::__cxx11::string::~string((string *)&local_1b0);
  pvVar3 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_38,1);
  std::__cxx11::string::string((string *)&local_1f0,(string *)pvVar3);
  AsmFuncts::getRegCode(&local_1d0,&local_1f0);
  std::__cxx11::string::operator=((string *)(rt.field_2._M_local_buf + 8),(string *)&local_1d0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::~string((string *)&local_1f0);
  pvVar3 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_38,3);
  uVar2 = std::__cxx11::stoi(pvVar3,(size_t *)0x0,10);
  Conversion::decToBin_abi_cxx11_(&local_210,(Conversion *)(ulong)uVar2,5,in_ECX);
  std::__cxx11::string::operator=((string *)(func.field_2._M_local_buf + 8),(string *)&local_210);
  std::__cxx11::string::~string((string *)&local_210);
  pvVar3 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_38,0);
  std::__cxx11::string::string((string *)&local_250,(string *)pvVar3);
  AsmFuncts::getFuncCode(&local_230,&local_250);
  std::__cxx11::string::operator=((string *)local_150,(string *)&local_230);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::~string((string *)&local_250);
LAB_00151525:
  std::operator+(&local_3f0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&rd.field_2 + 8));
  std::operator+(&local_3d0,&local_3f0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&shift.field_2 + 8));
  std::operator+(&local_3b0,&local_3d0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&rt.field_2 + 8));
  std::operator+(&local_390,&local_3b0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&func.field_2 + 8));
  std::operator+(__return_storage_ptr__,&local_390,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_150);
  std::__cxx11::string::~string((string *)&local_390);
  std::__cxx11::string::~string((string *)&local_3b0);
  std::__cxx11::string::~string((string *)&local_3d0);
  std::__cxx11::string::~string((string *)&local_3f0);
  std::__cxx11::string::~string((string *)local_150);
  std::__cxx11::string::~string((string *)(func.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(shift.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(rt.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(rd.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_90);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_38);
  return __return_storage_ptr__;
}

Assistant:

string Assembler::rType(string operation, int line){
    vector<string> v = HelpFuncts::split(operation,"(\\s|,)+");
    string opcode = AsmFuncts::getOpCode(v[0]);
    string rs,rd,rt,shift,func;
    if((v[0] == "sll") || (v[0] == "srl")){
        rs = Conversion::decToBin(0,5);
        rt = AsmFuncts::getRegCode(v[2]);
        rd = AsmFuncts::getRegCode(v[1]);
        shift = Conversion::decToBin(stoi(v[3]),5);
        func = AsmFuncts::getFuncCode(v[0]);
    }else{
        rs = AsmFuncts::getRegCode(v[2]);
        rt = AsmFuncts::getRegCode(v[3]);
        rd = AsmFuncts::getRegCode(v[1]);
        shift = Conversion::decToBin(0,5);
        func = AsmFuncts::getFuncCode(v[0]);
    }
    return (opcode + rs + rt + rd + shift + func);
}